

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

MockSupport * __thiscall MockSupport::getMockSupportScope(MockSupport *this,SimpleString *name)

{
  bool bVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  MockSupport *value;
  undefined4 extraout_var;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  SimpleString mockingSupportName;
  SimpleString local_88;
  undefined1 local_78 [96];
  
  SimpleString::SimpleString(&local_88,"!!!$$$MockingSupportScope$$$!!!");
  SimpleString::operator+=(&local_88,name);
  bVar1 = hasData(this,&local_88);
  if (bVar1) {
    pUVar3 = UtestShell::getCurrent();
    getData((MockNamedValue *)(local_78 + 0x10),this,&local_88);
    MockNamedValue::getType((MockNamedValue *)local_78);
    pcVar4 = SimpleString::asCharString((SimpleString *)local_78);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[9])
              (pUVar3,"MockSupport",pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
               ,0x1c6,pTVar5);
    SimpleString::~SimpleString((SimpleString *)local_78);
    MockNamedValue::~MockNamedValue((MockNamedValue *)(local_78 + 0x10));
    getData((MockNamedValue *)(local_78 + 0x10),this,&local_88);
    value = (MockSupport *)MockNamedValue::getObjectPointer((MockNamedValue *)(local_78 + 0x10));
    MockNamedValue::~MockNamedValue((MockNamedValue *)(local_78 + 0x10));
  }
  else {
    iVar2 = clone(this,(__fn *)name,__child_stack,in_ECX,in_R8);
    value = (MockSupport *)CONCAT44(extraout_var,iVar2);
    SimpleString::SimpleString((SimpleString *)(local_78 + 0x10),"MockSupport");
    setDataObject(this,&local_88,(SimpleString *)(local_78 + 0x10),value);
    SimpleString::~SimpleString((SimpleString *)(local_78 + 0x10));
  }
  SimpleString::~SimpleString(&local_88);
  return value;
}

Assistant:

MockSupport* MockSupport::getMockSupportScope(const SimpleString& name)
{
    SimpleString mockingSupportName = MOCK_SUPPORT_SCOPE_PREFIX;
    mockingSupportName += name;

    if (hasData(mockingSupportName)) {
        STRCMP_EQUAL("MockSupport", getData(mockingSupportName).getType().asCharString());
        return (MockSupport*) getData(mockingSupportName).getObjectPointer();
    }

    MockSupport *newMock = clone(name);

    setDataObject(mockingSupportName, "MockSupport", newMock);
    return newMock;
}